

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void sha256(void *data,int size,BYTE *hash)

{
  undefined1 local_90 [8];
  SHA256_CTX context;
  BYTE *hash_local;
  int size_local;
  void *data_local;
  
  context.state._24_8_ = hash;
  sha256_init((SHA256_CTX *)local_90);
  sha256_update((SHA256_CTX *)local_90,(BYTE *)data,(long)size);
  sha256_final((SHA256_CTX *)local_90,(BYTE *)context.state._24_8_);
  return;
}

Assistant:

void sha256(const void* data, int size, BYTE hash[32])
{
    SHA256_CTX context;

    sha256_init(&context);
    sha256_update(&context, (const BYTE*)data, size);
    sha256_final(&context, hash);
}